

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_f8fb87::addInterfaceEntry
               (cmGeneratorTarget *headTarget,string *config,string *prop,string *lang,
               cmGeneratorExpressionDAGChecker *dagChecker,EvaluatedTargetPropertyEntries *entries,
               LinkInterfaceFor interfaceFor,
               vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libraries)

{
  bool bVar1;
  reference item;
  cmLocalGenerator *lg;
  string_view arg;
  string local_290;
  string_view local_270;
  string local_260;
  cmListFileBacktrace local_240;
  string local_230;
  undefined1 local_210 [8];
  cmGeneratorExpressionContext context;
  cmListFileBacktrace local_a0;
  undefined1 local_90 [8];
  EvaluatedTargetPropertyEntry ee;
  cmLinkImplItem *lib;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  EvaluatedTargetPropertyEntries *entries_local;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  string *lang_local;
  string *prop_local;
  string *config_local;
  cmGeneratorTarget *headTarget_local;
  
  __end1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(libraries);
  lib = (cmLinkImplItem *)
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(libraries);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                *)&lib);
    if (!bVar1) break;
    item = __gnu_cxx::
           __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
           ::operator*(&__end1);
    ee._48_8_ = item;
    if ((item->super_cmLinkItem).Target != (cmGeneratorTarget *)0x0) {
      cmListFileBacktrace::cmListFileBacktrace(&local_a0,&(item->super_cmLinkItem).Backtrace);
      EvaluatedTargetPropertyEntry::EvaluatedTargetPropertyEntry
                ((EvaluatedTargetPropertyEntry *)local_90,item,&local_a0);
      cmListFileBacktrace::~cmListFileBacktrace(&local_a0);
      lg = cmGeneratorTarget::GetLocalGenerator(headTarget);
      std::__cxx11::string::string((string *)&local_230,(string *)config);
      cmListFileBacktrace::cmListFileBacktrace(&local_240,(cmListFileBacktrace *)(ee._48_8_ + 0x30))
      ;
      std::__cxx11::string::string((string *)&local_260,(string *)lang);
      cmGeneratorExpressionContext::cmGeneratorExpressionContext
                ((cmGeneratorExpressionContext *)local_210,lg,&local_230,false,headTarget,headTarget
                 ,true,&local_240,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      cmListFileBacktrace::~cmListFileBacktrace(&local_240);
      std::__cxx11::string::~string((string *)&local_230);
      cmGeneratorTarget::EvaluateInterfaceProperty
                (&local_290,*(cmGeneratorTarget **)(ee._48_8_ + 0x20),prop,
                 (cmGeneratorExpressionContext *)local_210,dagChecker,interfaceFor);
      arg = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_290);
      local_270 = arg;
      cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ee.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                           TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,false);
      std::__cxx11::string::~string((string *)&local_290);
      ee.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = context.CurrentTarget._2_1_ & 1;
      std::
      vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ::emplace_back<(anonymous_namespace)::EvaluatedTargetPropertyEntry>
                (&entries->Entries,(EvaluatedTargetPropertyEntry *)local_90);
      cmGeneratorExpressionContext::~cmGeneratorExpressionContext
                ((cmGeneratorExpressionContext *)local_210);
      EvaluatedTargetPropertyEntry::~EvaluatedTargetPropertyEntry
                ((EvaluatedTargetPropertyEntry *)local_90);
    }
    __gnu_cxx::
    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void addInterfaceEntry(cmGeneratorTarget const* headTarget,
                       std::string const& config, std::string const& prop,
                       std::string const& lang,
                       cmGeneratorExpressionDAGChecker* dagChecker,
                       EvaluatedTargetPropertyEntries& entries,
                       LinkInterfaceFor interfaceFor,
                       std::vector<cmLinkImplItem> const& libraries)
{
  for (cmLinkImplItem const& lib : libraries) {
    if (lib.Target) {
      EvaluatedTargetPropertyEntry ee(lib, lib.Backtrace);
      // Pretend $<TARGET_PROPERTY:lib.Target,prop> appeared in our
      // caller's property and hand-evaluate it as if it were compiled.
      // Create a context as cmCompiledGeneratorExpression::Evaluate does.
      cmGeneratorExpressionContext context(
        headTarget->GetLocalGenerator(), config, false, headTarget, headTarget,
        true, lib.Backtrace, lang);
      cmExpandList(lib.Target->EvaluateInterfaceProperty(
                     prop, &context, dagChecker, interfaceFor),
                   ee.Values);
      ee.ContextDependent = context.HadContextSensitiveCondition;
      entries.Entries.emplace_back(std::move(ee));
    }
  }
}